

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtoa.c
# Opt level: O2

ULong any_on(Bigint *b,int k)

{
  uint uVar1;
  uint uVar2;
  long lVar3;
  uint uVar4;
  long lVar5;
  
  uVar1 = b->wds;
  uVar2 = (uint)k >> 5;
  uVar4 = uVar1;
  if (((((int)uVar1 < (int)uVar2) || (uVar4 = uVar2, uVar1 <= uVar2)) || ((k & 0x1fU) == 0)) ||
     ((b->x[uVar2] & ~(-1 << (sbyte)(k & 0x1fU))) == 0)) {
    lVar5 = (long)(int)uVar4 * 4 + 0x18;
    do {
      if (lVar5 < 0x19) {
        return 0;
      }
      lVar3 = lVar5 + -0x1c;
      lVar5 = lVar5 + -4;
    } while (*(int *)((long)b->x + lVar3) == 0);
  }
  return 1;
}

Assistant:

static ULong
any_on(Bigint *b, int k)
{
	int n, nwds;
	ULong *x, *x0, x1, x2;

	x = b->x;
	nwds = b->wds;
	n = k >> kshift;
	if (n > nwds)
		n = nwds;
	else if (n < nwds && (k &= kmask)) {
		x1 = x2 = x[n];
		x1 >>= k;
		x1 <<= k;
		if (x1 != x2)
			return 1;
		}
	x0 = x;
	x += n;
	while(x > x0)
		if (*--x)
			return 1;
	return 0;
	}